

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O1

float __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadAttribute<float>(OgreXmlSerializer *this,char *name)

{
  XmlReader *reader;
  int iVar1;
  undefined4 extraout_var;
  float extraout_XMM0_Da;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  iVar1 = (*this->m_reader->_vptr_IIrrXMLReader[7])();
  reader = this->m_reader;
  if (CONCAT44(extraout_var,iVar1) != 0) {
    (*reader->_vptr_IIrrXMLReader[0xb])(reader,name);
    return extraout_XMM0_Da;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,name,&local_51);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  ThrowAttibuteError(reader,&local_30,&local_50);
}

Assistant:

float OgreXmlSerializer::ReadAttribute<float>(const char *name) const
{
    if (HasAttribute(name))
    {
        return m_reader->getAttributeValueAsFloat(name);
    }
    else
    {
        ThrowAttibuteError(m_reader, name);
        return 0;
    }
}